

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImVec2 *lhs;
  ImDrawList *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImGuiWindow *this;
  float fVar4;
  ImGuiCol local_e4;
  bool local_b6;
  bool local_b5;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_ac;
  ImVec2 local_a4;
  undefined1 local_9c [8];
  ImRect image_bb;
  ImVec2 local_84;
  ImVec2 local_7c;
  undefined1 local_74 [8];
  ImRect bb;
  ImVec2 padding;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec4 *bg_col_local;
  int frame_padding_local;
  ImVec2 *uv1_local;
  ImVec2 *uv0_local;
  ImVec2 *size_local;
  ImTextureID user_texture_id_local;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    register0x00000000 = &GImGui->Style;
    PushID(user_texture_id);
    padding.x = (float)ImGuiWindow::GetID(this,"#image",(char *)0x0);
    PopID();
    if (frame_padding < 0) {
      bb.Max = stack0xffffffffffffffa8->FramePadding;
    }
    else {
      ImVec2::ImVec2(&bb.Max,(float)frame_padding,(float)frame_padding);
    }
    local_84 = ::operator+(&(this->DC).CursorPos,size);
    lhs = &bb.Max;
    image_bb.Max = ::operator*(lhs,2.0);
    local_7c = ::operator+(&local_84,&image_bb.Max);
    ImRect::ImRect((ImRect *)local_74,&(this->DC).CursorPos,&local_7c);
    local_a4 = ::operator+(&(this->DC).CursorPos,lhs);
    _col = ::operator+(&(this->DC).CursorPos,lhs);
    local_ac = ::operator+((ImVec2 *)&col,size);
    ImRect::ImRect((ImRect *)local_9c,&local_a4,&local_ac);
    ItemSize((ImRect *)local_74,0.0);
    bVar2 = ItemAdd((ImRect *)local_74,(ImGuiID *)&padding);
    if (bVar2) {
      user_texture_id_local._7_1_ =
           ButtonBehavior((ImRect *)local_74,(ImGuiID)padding.x,&local_b5,&local_b6,0);
      if (((local_b5 & 1U) == 0) || ((local_b6 & 1U) == 0)) {
        local_e4 = 0x16;
        if ((local_b5 & 1U) != 0) {
          local_e4 = 0x17;
        }
      }
      else {
        local_e4 = 0x18;
      }
      IVar3 = GetColorU32(local_e4,1.0);
      fVar4 = ImMin(bb.Max.x,bb.Max.y);
      fVar4 = ImClamp(fVar4,0.0,stack0xffffffffffffffa8->FrameRounding);
      RenderFrame((ImVec2)local_74,bb.Min,IVar3,true,fVar4);
      if (0.0 < bg_col->w) {
        pIVar1 = this->DrawList;
        IVar3 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar1,(ImVec2 *)local_9c,&image_bb.Min,IVar3,0.0,0xf);
      }
      pIVar1 = this->DrawList;
      IVar3 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar1,user_texture_id,(ImVec2 *)local_9c,&image_bb.Min,uv0,uv1,IVar3);
    }
    else {
      user_texture_id_local._7_1_ = false;
    }
  }
  else {
    user_texture_id_local._7_1_ = false;
  }
  return user_texture_id_local._7_1_;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    // We could hash the size/uv to create a unique ID but that would prevent the user from animating UV.
    PushID((void *)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    const ImVec2 padding = (frame_padding >= 0) ? ImVec2((float)frame_padding, (float)frame_padding) : style.FramePadding;
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding*2);
    const ImRect image_bb(window->DC.CursorPos + padding, window->DC.CursorPos + padding + size);
    ItemSize(bb);
    if (!ItemAdd(bb, &id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((hovered && held) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(image_bb.Min, image_bb.Max, GetColorU32(bg_col));
    window->DrawList->AddImage(user_texture_id, image_bb.Min, image_bb.Max, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}